

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_32x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  undefined8 *puVar1;
  code *pcVar2;
  code *pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  int32_t *piVar14;
  int32_t *piVar15;
  undefined7 in_register_00000009;
  long lVar16;
  undefined4 *puVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  ulong *puVar21;
  undefined4 *puVar22;
  longlong *plVar23;
  undefined1 auVar24 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar29 [16];
  __m128i in [64];
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  ulong auStack_498 [2];
  ulong auStack_488 [2];
  undefined8 auStack_478 [2];
  undefined8 uStack_468;
  undefined8 uStack_460;
  ulong auStack_458 [2];
  int8_t *local_448;
  int32_t *local_440;
  longlong local_438 [48];
  undefined4 local_2b8 [162];
  
  uVar18 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
  pcVar2 = *(code **)((long)row_highbd_txfm32x8_arr + uVar18);
  pcVar3 = *(code **)((long)col_highbd_txfm8x32_arr + uVar18);
  local_448 = av1_fwd_txfm_shift_ls[0x10];
  iVar19 = (int)*av1_fwd_txfm_shift_ls[0x10];
  puVar21 = (ulong *)(input + 0x1c);
  lVar16 = 0x70;
  do {
    *(ulong *)((long)&uStack_4a8 + lVar16) = puVar21[-7];
    *(undefined8 *)((long)&uStack_4a0 + lVar16) = 0;
    *(ulong *)((long)auStack_498 + lVar16) = puVar21[-6];
    *(undefined8 *)((long)auStack_498 + lVar16 + 8) = 0;
    *(ulong *)((long)auStack_488 + lVar16) = puVar21[-5];
    *(undefined8 *)((long)auStack_488 + lVar16 + 8) = 0;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = puVar21[-4];
    *(undefined1 (*) [16])((long)auStack_478 + lVar16) = auVar24;
    auVar24 = pmovsxwd(auVar24,*(undefined8 *)((long)&uStack_4a8 + lVar16));
    auVar25 = pmovsxwd(in_XMM2,*(undefined8 *)((long)auStack_498 + lVar16));
    auVar26 = pmovsxwd(in_XMM3,*(undefined8 *)((long)auStack_488 + lVar16));
    auVar29 = pmovsxwd(in_XMM4,*(undefined8 *)((long)auStack_478 + lVar16));
    auVar28._0_4_ = auVar25._0_4_ << iVar19;
    auVar28._4_4_ = auVar25._4_4_;
    auVar28._8_4_ = auVar25._8_4_;
    auVar28._12_4_ = auVar25._12_4_;
    *(int *)((long)&uStack_4a8 + lVar16) = auVar24._0_4_ << iVar19;
    *(int *)((long)&uStack_4a8 + lVar16 + 4) = auVar24._4_4_;
    *(int *)((long)&uStack_4a0 + lVar16) = auVar24._8_4_;
    *(int *)((long)auStack_498 + lVar16 + -4) = auVar24._12_4_;
    *(undefined1 (*) [16])((long)auStack_498 + lVar16) = auVar28;
    auVar27._0_4_ = auVar26._0_4_ << iVar19;
    auVar27._4_4_ = auVar26._4_4_;
    auVar27._8_4_ = auVar26._8_4_;
    auVar27._12_4_ = auVar26._12_4_;
    *(undefined1 (*) [16])((long)auStack_488 + lVar16) = auVar27;
    auVar26._0_4_ = auVar29._0_4_ << iVar19;
    auVar26._4_4_ = auVar29._4_4_;
    auVar26._8_4_ = auVar29._8_4_;
    auVar26._12_4_ = auVar29._12_4_;
    *(undefined1 (*) [16])((long)auStack_478 + lVar16) = auVar26;
    *(ulong *)((long)&uStack_468 + lVar16) = puVar21[-3];
    *(undefined8 *)((long)&uStack_460 + lVar16) = 0;
    *(ulong *)((long)auStack_458 + lVar16) = puVar21[-2];
    *(undefined8 *)((long)auStack_458 + lVar16 + 8) = 0;
    *(ulong *)((long)&local_448 + lVar16) = puVar21[-1];
    *(undefined8 *)((long)local_438 + lVar16 + -8) = 0;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = *puVar21;
    *(undefined1 (*) [16])((long)local_438 + lVar16) = auVar25;
    auVar24 = pmovsxwd(auVar25,*(undefined8 *)((long)&uStack_468 + lVar16));
    auVar25 = pmovsxwd(auVar28,*(undefined8 *)((long)auStack_458 + lVar16));
    auVar28 = pmovsxwd(auVar27,*(undefined8 *)((long)&local_448 + lVar16));
    auVar26 = pmovsxwd(auVar26,*(undefined8 *)((long)local_438 + lVar16));
    *(int *)((long)&uStack_468 + lVar16) = auVar24._0_4_ << iVar19;
    *(int *)((long)&uStack_468 + lVar16 + 4) = auVar24._4_4_;
    *(int *)((long)&uStack_460 + lVar16) = auVar24._8_4_;
    *(int *)((long)auStack_458 + lVar16 + -4) = auVar24._12_4_;
    in_XMM2._0_4_ = auVar25._0_4_ << iVar19;
    in_XMM2._4_4_ = auVar25._4_4_;
    in_XMM2._8_4_ = auVar25._8_4_;
    in_XMM2._12_4_ = auVar25._12_4_;
    in_XMM3._0_4_ = auVar28._0_4_ << iVar19;
    in_XMM3._4_4_ = auVar28._4_4_;
    in_XMM3._8_4_ = auVar28._8_4_;
    in_XMM3._12_4_ = auVar28._12_4_;
    *(undefined1 (*) [16])((long)auStack_458 + lVar16) = in_XMM2;
    *(undefined1 (*) [16])((long)&local_448 + lVar16) = in_XMM3;
    in_XMM4._0_4_ = auVar26._0_4_ << iVar19;
    in_XMM4._4_4_ = auVar26._4_4_;
    in_XMM4._8_4_ = auVar26._8_4_;
    in_XMM4._12_4_ = auVar26._12_4_;
    *(undefined1 (*) [16])((long)local_438 + lVar16) = in_XMM4;
    lVar16 = lVar16 + 0x80;
    puVar21 = (ulong *)((long)puVar21 + (long)stride * 2);
  } while (lVar16 != 0x470);
  uVar18 = 0xfffffffffffffffe;
  plVar23 = local_438;
  local_440 = coeff;
  do {
    auStack_458[1] = 0x422910;
    (*pcVar2)(plVar23,plVar23,0xd,8);
    uVar18 = uVar18 + 2;
    plVar23 = plVar23 + 4;
  } while (uVar18 < 6);
  auStack_458[1] = 0x422932;
  col_txfm_16x16_rounding((__m128i *)local_438,-(int)local_448[1]);
  piVar14 = local_440;
  piVar15 = local_440 + 0x18;
  puVar17 = local_2b8;
  lVar16 = 0;
  do {
    lVar20 = -0x20;
    puVar22 = puVar17;
    do {
      uVar9 = puVar22[-0x5f];
      uVar4 = puVar22[-0x3f];
      uVar10 = puVar22[-0x20];
      uVar11 = puVar22[-0x1f];
      uVar12 = puVar22[-0x1e];
      uVar13 = puVar22[-0x1d];
      uVar5 = *puVar22;
      uVar6 = puVar22[1];
      uVar7 = puVar22[2];
      uVar8 = puVar22[3];
      auVar29._0_8_ = CONCAT44(puVar22[-0x3e],puVar22[-0x5e]);
      auVar29._8_4_ = puVar22[-0x5d];
      auVar29._12_4_ = puVar22[-0x3d];
      puVar1 = (undefined8 *)((long)piVar15 + lVar20 + -0x40);
      *puVar1 = CONCAT44(puVar22[-0x40],puVar22[-0x60]);
      puVar1[1] = CONCAT44(uVar5,uVar10);
      *(undefined4 *)((long)piVar15 + lVar20 + -0x18) = uVar9;
      *(undefined4 *)((long)piVar15 + lVar20 + -0x14) = uVar4;
      *(undefined4 *)((long)piVar15 + lVar20 + -0x10) = uVar11;
      *(undefined4 *)((long)piVar15 + lVar20 + -0xc) = uVar6;
      puVar1 = (undefined8 *)((long)piVar15 + lVar20);
      *puVar1 = auVar29._0_8_;
      *(undefined4 *)(puVar1 + 1) = uVar12;
      *(undefined4 *)((long)puVar1 + 0xc) = uVar7;
      puVar1 = (undefined8 *)((long)piVar15 + lVar20 + 0x20);
      *puVar1 = auVar29._8_8_;
      *(undefined4 *)(puVar1 + 2) = uVar13;
      *(undefined4 *)((long)puVar1 + 0x14) = uVar8;
      puVar22 = puVar22 + 0x80;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0);
    lVar16 = lVar16 + 1;
    piVar15 = piVar15 + 0x20;
    puVar17 = puVar17 + 4;
  } while (lVar16 != 8);
  lVar16 = 0;
  do {
    auStack_458[1] = 0x4229e4;
    (*pcVar3)((long)piVar14 + lVar16,(long)piVar14 + lVar16,0xc,2);
    lVar16 = lVar16 + 0x10;
  } while (lVar16 == 0x10);
  return;
}

Assistant:

void av1_fwd_txfm2d_32x8_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[64];
  __m128i *outcoef128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_32X8];
  const int txw_idx = get_txw_idx(TX_32X8);
  const int txh_idx = get_txh_idx(TX_32X8);
  const fwd_transform_1d_sse4_1 col_txfm = row_highbd_txfm32x8_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = col_highbd_txfm8x32_arr[tx_type];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];

  const int txfm_size_col = tx_size_wide[TX_32X8];
  const int txfm_size_row = tx_size_high[TX_32X8];
  const int num_col = txfm_size_row >> 2;

  // column transform
  load_buffer_32x8n(input, in, stride, 0, 0, shift[0], 8);
  for (int i = 0; i < txfm_size_row; i += 2) {
    col_txfm((in + i), (in + i), bitcol, txfm_size_row);
  }

  col_txfm_16x16_rounding(&in[0], -shift[1]);
  transpose_8nx8n(in, outcoef128, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < num_col; i++) {
    row_txfm((outcoef128 + i), (outcoef128 + i), bitrow, num_col);
  }
  (void)bd;
}